

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileExpr(jx9_gen_state *pGen,sxi32 iFlags,
                    _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xTreeValidator)

{
  SyToken *pSVar1;
  bool bVar2;
  SyToken *pTmp;
  SyToken *pEnd2;
  int local_68;
  sxi32 rc;
  sxi32 iNest;
  sxi32 nExpr;
  SyToken *pEnd;
  SySet sExprNode;
  jx9_expr_node *pRoot;
  _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xTreeValidator_local;
  sxi32 iFlags_local;
  jx9_gen_state *pGen_local;
  
  bVar2 = false;
  sExprNode.pUserData = (void *)0x0;
  SySetInit((SySet *)&pEnd,&pGen->pVm->sAllocator,8);
  SySetAlloc((SySet *)&pEnd,0x10);
  _iNest = pGen->pIn;
  local_68 = 0;
  for (; _iNest < pGen->pEnd; _iNest = _iNest + 1) {
    if ((_iNest->nType & 0x40) == 0) {
      if ((_iNest->nType & 0x80) == 0) {
        if (((_iNest->nType & 0x40000) != 0) && (local_68 < 1)) break;
      }
      else {
        local_68 = local_68 + -1;
      }
    }
    else {
      local_68 = local_68 + 1;
    }
  }
  if ((iFlags & 4U) != 0) {
    pTmp = pGen->pIn;
    local_68 = 0;
    for (; pTmp < _iNest; pTmp = pTmp + 1) {
      if ((pTmp->nType & 0xa40) == 0) {
        if ((pTmp->nType & 0x1480) == 0) {
          if (((pTmp->nType & 0x20000) != 0) && (local_68 < 1)) break;
        }
        else {
          local_68 = local_68 + -1;
        }
      }
      else {
        local_68 = local_68 + 1;
      }
    }
    if (pTmp < _iNest) {
      _iNest = pTmp;
    }
  }
  if (pGen->pIn < _iNest) {
    pSVar1 = pGen->pEnd;
    pGen->pEnd = _iNest;
    pEnd2._4_4_ = jx9ExprMakeTree(pGen,(SySet *)&pEnd,(jx9_expr_node **)&sExprNode.pUserData);
    if ((pEnd2._4_4_ == 0) && (sExprNode.pUserData != (void *)0x0)) {
      pEnd2._4_4_ = 0;
      if (xTreeValidator != (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0) {
        pEnd2._4_4_ = (*xTreeValidator)(pGen,(jx9_expr_node *)sExprNode.pUserData);
      }
      if (pEnd2._4_4_ != -10) {
        pEnd2._4_4_ = GenStateEmitExprCode(pGen,(jx9_expr_node *)sExprNode.pUserData,iFlags);
      }
      bVar2 = true;
    }
    jx9ExprFreeTree(pGen,(SySet *)&pEnd);
    pGen->pEnd = pSVar1;
    pGen->pIn = _iNest;
    if (pEnd2._4_4_ == -10) {
      SySetRelease((SySet *)&pEnd);
      return -10;
    }
  }
  SySetRelease((SySet *)&pEnd);
  pGen_local._4_4_ = -3;
  if (bVar2) {
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileExpr(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags,        /* Control flags */
	sxi32 (*xTreeValidator)(jx9_gen_state *, jx9_expr_node *) /* Node validator callback.NULL otherwise */
	)
{
	jx9_expr_node *pRoot;
	SySet sExprNode;
	SyToken *pEnd;
	sxi32 nExpr;
	sxi32 iNest;
	sxi32 rc;
	/* Initialize worker variables */
	nExpr = 0;
	pRoot = 0;
	SySetInit(&sExprNode, &pGen->pVm->sAllocator, sizeof(jx9_expr_node *));
	SySetAlloc(&sExprNode, 0x10);
	rc = SXRET_OK;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	iNest = 0;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_OCB /* '{' */ ){
			/* Ticket 1433-30: Annonymous/Closure functions body */
			iNest++;
		}else if(pEnd->nType & JX9_TK_CCB /* '}' */ ){
			iNest--;
		}else if( pEnd->nType & JX9_TK_SEMI /* ';' */ ){
			if( iNest <= 0 ){
				break;
			}
		}
		pEnd++;
	}
	if( iFlags & EXPR_FLAG_COMMA_STATEMENT ){
		SyToken *pEnd2 = pGen->pIn;
		iNest = 0;
		/* Stop at the first comma */
		while( pEnd2 < pEnd ){
			if( pEnd2->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_LPAREN/*'('*/) ){
				iNest++;
			}else if(pEnd2->nType & (JX9_TK_CCB/*'}'*/|JX9_TK_CSB/*']'*/|JX9_TK_RPAREN/*')'*/)){
				iNest--;
			}else if( pEnd2->nType & JX9_TK_COMMA /*','*/ ){
				if( iNest <= 0 ){
					break;
				}
			}
			pEnd2++;
		}
		if( pEnd2 <pEnd ){
			pEnd = pEnd2;
		}
	}
	if( pEnd > pGen->pIn ){
		SyToken *pTmp = pGen->pEnd;
		/* Swap delimiter */
		pGen->pEnd = pEnd;
		/* Try to get an expression tree */
		rc = jx9ExprMakeTree(&(*pGen), &sExprNode, &pRoot);
		if( rc == SXRET_OK && pRoot ){
			rc = SXRET_OK;
			if( xTreeValidator ){
				/* Call the upper layer validator callback */
				rc = xTreeValidator(&(*pGen), pRoot);
			}
			if( rc != SXERR_ABORT ){
				/* Generate code for the given tree */
				rc = GenStateEmitExprCode(&(*pGen), pRoot, iFlags);
			}
			nExpr = 1;
		}
		/* Release the whole tree */
		jx9ExprFreeTree(&(*pGen), &sExprNode);
		/* Synchronize token stream */
		pGen->pEnd = pTmp;
		pGen->pIn  = pEnd;
		if( rc == SXERR_ABORT ){
			SySetRelease(&sExprNode);
			return SXERR_ABORT;
		}
	}
	SySetRelease(&sExprNode);
	return nExpr > 0 ? SXRET_OK : SXERR_EMPTY;
}